

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

String * __thiscall asl::File::name(String *__return_storage_ptr__,File *this)

{
  char *pcVar1;
  int i;
  anon_union_16_2_78e7fdac_for_String_2 *__s;
  
  if ((this->_path)._size == 0) {
    __s = &(this->_path).field_2;
  }
  else {
    __s = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_path).field_2._str;
  }
  pcVar1 = strrchr(__s->_space,0x2f);
  i = 0;
  if (pcVar1 != (char *)0x0) {
    i = ((int)pcVar1 - (int)__s) + 1;
  }
  String::substring(__return_storage_ptr__,&this->_path,i,(this->_path)._len);
  return __return_storage_ptr__;
}

Assistant:

String File::name() const
{
	int n = _path.lastIndexOf(SEP);
#ifdef _WIN32
	int m = _path.lastIndexOf('/');
	n = (m > n)? m : n;
#endif
	return _path.substring(n+1);
}